

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O0

void SharpYUVUpdateRGB_SSE2(int16_t *ref,int16_t *src,int16_t *dst,int len)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int local_98;
  short sStack_78;
  short sStack_76;
  int diff_uv;
  __m128i E;
  __m128i D;
  __m128i C;
  __m128i B;
  __m128i A;
  int i;
  int len_local;
  int16_t *dst_local;
  int16_t *src_local;
  int16_t *ref_local;
  
  for (local_98 = 0; local_98 + 8 <= len; local_98 = local_98 + 8) {
    uVar1 = *(undefined8 *)(ref + local_98);
    uVar2 = *(undefined8 *)(ref + local_98 + 4);
    uVar3 = *(undefined8 *)(src + local_98);
    uVar4 = *(undefined8 *)(src + local_98 + 4);
    uVar5 = *(undefined8 *)(dst + local_98);
    uVar6 = *(undefined8 *)(dst + local_98 + 4);
    E[1]._0_2_ = (short)uVar1;
    E[1]._2_2_ = (short)((ulong)uVar1 >> 0x10);
    E[1]._4_2_ = (short)((ulong)uVar1 >> 0x20);
    E[1]._6_2_ = (short)((ulong)uVar1 >> 0x30);
    D[0]._0_2_ = (short)uVar2;
    D[0]._2_2_ = (short)((ulong)uVar2 >> 0x10);
    D[0]._4_2_ = (short)((ulong)uVar2 >> 0x20);
    D[0]._6_2_ = (short)((ulong)uVar2 >> 0x30);
    sStack_78 = (short)uVar3;
    sStack_76 = (short)((ulong)uVar3 >> 0x10);
    diff_uv._0_2_ = (short)((ulong)uVar3 >> 0x20);
    diff_uv._2_2_ = (short)((ulong)uVar3 >> 0x30);
    E[0]._0_2_ = (short)uVar4;
    E[0]._2_2_ = (short)((ulong)uVar4 >> 0x10);
    E[0]._4_2_ = (short)((ulong)uVar4 >> 0x20);
    E[0]._6_2_ = (short)((ulong)uVar4 >> 0x30);
    C[1]._0_2_ = (short)uVar5;
    C[1]._2_2_ = (short)((ulong)uVar5 >> 0x10);
    C[1]._4_2_ = (short)((ulong)uVar5 >> 0x20);
    C[1]._6_2_ = (short)((ulong)uVar5 >> 0x30);
    B[0]._0_2_ = (short)uVar6;
    B[0]._2_2_ = (short)((ulong)uVar6 >> 0x10);
    B[0]._4_2_ = (short)((ulong)uVar6 >> 0x20);
    B[0]._6_2_ = (short)((ulong)uVar6 >> 0x30);
    *(ulong *)(dst + local_98) =
         CONCAT26(C[1]._6_2_ + (E[1]._6_2_ - diff_uv._2_2_),
                  CONCAT24(C[1]._4_2_ + (E[1]._4_2_ - (short)diff_uv),
                           CONCAT22(C[1]._2_2_ + (E[1]._2_2_ - sStack_76),
                                    (short)C[1] + ((short)E[1] - sStack_78))));
    *(ulong *)(dst + local_98 + 4) =
         CONCAT26(B[0]._6_2_ + (D[0]._6_2_ - E[0]._6_2_),
                  CONCAT24(B[0]._4_2_ + (D[0]._4_2_ - E[0]._4_2_),
                           CONCAT22(B[0]._2_2_ + (D[0]._2_2_ - E[0]._2_2_),
                                    (short)B[0] + ((short)D[0] - (short)E[0]))));
  }
  for (; local_98 < len; local_98 = local_98 + 1) {
    dst[local_98] = dst[local_98] + (ref[local_98] - src[local_98]);
  }
  return;
}

Assistant:

static void SharpYUVUpdateRGB_SSE2(const int16_t* ref, const int16_t* src,
                                   int16_t* dst, int len) {
  int i = 0;
  for (i = 0; i + 8 <= len; i += 8) {
    const __m128i A = _mm_loadu_si128((const __m128i*)(ref + i));
    const __m128i B = _mm_loadu_si128((const __m128i*)(src + i));
    const __m128i C = _mm_loadu_si128((const __m128i*)(dst + i));
    const __m128i D = _mm_sub_epi16(A, B);   // diff_uv
    const __m128i E = _mm_add_epi16(C, D);   // new_uv
    _mm_storeu_si128((__m128i*)(dst + i), E);
  }
  for (; i < len; ++i) {
    const int diff_uv = ref[i] - src[i];
    dst[i] += diff_uv;
  }
}